

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_chi2_test<trng::geometric_dist>(geometric_dist *d)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  double *__src;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  lcg64_shift R;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  undefined1 local_c8 [16];
  lcg64_shift local_b0;
  AssertionHandler local_98;
  StringRef local_50;
  StringRef local_40;
  SourceLineInfo local_30;
  
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  iVar5 = 0;
  do {
    local_c8._0_8_ = (d->P).p_;
    dVar2 = pow((d->P).q_,(double)iVar5);
    local_98.m_assertionInfo.macroName.m_start = (char *)(dVar2 * (double)local_c8._0_8_);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_98);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_98.m_assertionInfo.macroName.m_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar5 = iVar5 + 1;
    dVar2 = pow((d->P).q_,(double)iVar5);
  } while (1.0 - dVar2 <= 0.99);
  dVar2 = pow((d->P).q_,(double)(int)((uint)(1.0 - dVar2 <= 0.99) + iVar5));
  local_98.m_assertionInfo.macroName.m_start = (char *)(dVar2 + -1.0 + 1.0);
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_f8,
               (iterator)
               local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)&local_98);
  }
  else {
    *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = (double)local_98.m_assertionInfo.macroName.m_start;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  iVar9 = (int)((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_98.m_assertionInfo.macroName.m_start =
       (char *)((ulong)local_98.m_assertionInfo.macroName.m_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)iVar9,(value_type_conflict *)&local_98,(allocator_type *)&local_b0);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_b0,100,P);
  iVar9 = iVar9 + -1;
  iVar5 = 10000;
  do {
    local_b0.S.r = local_b0.S.r * local_b0.P.a + local_b0.P.b;
    uVar4 = local_b0.S.r >> 0x11 ^ local_b0.S.r;
    uVar4 = uVar4 << 0x1f ^ uVar4;
    dVar2 = log((double)(uVar4 >> 1 ^ uVar4 >> 9) * 1.084202172485504e-19 + 2.220446049250313e-16);
    iVar3 = (int)(dVar2 * (d->P).one_over_ln_q_);
    if (iVar9 < iVar3) {
      iVar3 = iVar9;
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar3] = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar3] + 1;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  do {
    if ((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x11) break;
    piVar6 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar8 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar6 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar7 = piVar6;
        if (*piVar8 <= *piVar6) {
          piVar7 = piVar8;
        }
        piVar6 = piVar6 + 1;
        piVar8 = piVar7;
      } while (piVar6 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    iVar5 = *piVar7;
    if (8 < iVar5) break;
    lVar10 = (long)piVar7 -
             (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)
             ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar10 * 2);
    __src = (double *)(puVar1 + 1);
    local_c8._0_8_ = *puVar1;
    iVar9 = *piVar7;
    if (__src != local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 * 2),__src,
              (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    piVar6 = (int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10 + 4);
    if (piVar6 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10),piVar6,
              (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar6);
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    piVar6 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar8 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar6 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar7 = piVar6;
        if (*piVar8 <= *piVar6) {
          piVar7 = piVar8;
        }
        piVar6 = piVar6 + 1;
        piVar8 = piVar7;
      } while (piVar6 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    *(double *)
     ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
     ((long)piVar7 -
     (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         (double)local_c8._0_8_ +
         *(double *)
          ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
          ((long)piVar7 -
          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) * 2);
    *piVar7 = *piVar7 + iVar9;
  } while (iVar5 < 9);
  dVar2 = chi_percentil(&local_f8,&local_e0);
  local_c8._8_4_ = extraout_XMM0_Dc;
  local_c8._0_8_ = dVar2;
  local_c8._12_4_ = extraout_XMM0_Dd;
  local_50.m_start = "REQUIRE";
  local_50.m_size = 7;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_30.line = 0x11c;
  Catch::StringRef::StringRef(&local_40,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler(&local_98,&local_50,&local_30,local_40,Normal);
  local_50.m_start =
       (char *)(CONCAT71(local_50.m_start._1_7_,
                         -((double)local_c8._0_8_ < 0.99) & -(0.01 < (double)local_c8._0_8_)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&local_98,(ExprLhs<bool> *)&local_50);
  Catch::AssertionHandler::complete(&local_98);
  if (local_98.m_completed == false) {
    (*(local_98.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}